

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O2

int test_map2json_primitive(void)

{
  int iVar1;
  map2json_t *obj;
  char *pcVar2;
  char primitiveMethod [12];
  
  obj = map2json_init((char *)0x0);
  builtin_strncpy(primitiveMethod + 8,"n()",4);
  builtin_strncpy(primitiveMethod,"\x1bfunctio",8);
  map2json_push(obj,"fakePrimitive",primitiveMethod);
  pcVar2 = map2json_create(obj);
  printf("Expected: \t%s\nActual: \t%s\n\n","{\"fakePrimitive\":function()}",pcVar2);
  pcVar2 = map2json_create(obj);
  iVar1 = strcmp("{\"fakePrimitive\":function()}",pcVar2);
  if (iVar1 == 0) {
    map2json_destroy(obj);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int test_map2json_primitive() {
	map2json_t *map2jsonObj = map2json_init(NULL);

	char primitiveMethod[] = " function()";
	*primitiveMethod = JSON2MAP_PRIMITIVE_PREFIXER;
	map2json_push(map2jsonObj, "fakePrimitive", primitiveMethod);

	ASSERTSTR("{\"fakePrimitive\":function()}", map2json_create(map2jsonObj));
	map2json_destroy(map2jsonObj);
	return 0;
}